

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O0

Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* shaderPreprocessor_abi_cxx11_
            (Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Source *flat)

{
  Type TVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  UniformsMap *this;
  vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_> *this_00;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f8;
  reference local_d8;
  Chunk *chunk;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_> *__range1_1;
  type *local_98;
  type *decl;
  type *name;
  _Self local_80;
  const_iterator __end1;
  const_iterator __begin1;
  UniformsMap *__range1;
  undefined1 local_38 [8];
  string source;
  Source *flat_local;
  
  source.field_2._8_8_ = flat;
  std::__cxx11::string::string((string *)local_38);
  iVar3 = shader::Source::version((Source *)source.field_2._8_8_);
  if (iVar3 != 0) {
    uVar4 = shader::Source::version((Source *)source.field_2._8_8_);
    format_abi_cxx11_((string *)&__range1,"#version %d\n",(ulong)uVar4);
    std::__cxx11::string::operator=((string *)local_38,(string *)&__range1);
    std::__cxx11::string::~string((string *)&__range1);
  }
  this = shader::Source::uniforms_abi_cxx11_((Source *)source.field_2._8_8_);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
           ::begin(this);
  local_80._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
       ::end(this);
  while (bVar2 = std::operator!=(&__end1,&local_80), bVar2) {
    name = &std::
            _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>
            ::operator*(&__end1)->first;
    decl = (type *)std::get<0ul,std::__cxx11::string_const,shader::UniformDeclaration>
                             ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>
                               *)name);
    local_98 = std::get<1ul,std::__cxx11::string_const,shader::UniformDeclaration>
                         ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>
                           *)name);
    switch(local_98->type) {
    case Float:
      std::__cxx11::string::operator+=((string *)local_38,"uniform float ");
      break;
    case Vec2:
      std::__cxx11::string::operator+=((string *)local_38,"uniform vec2 ");
      break;
    case Vec3:
      std::__cxx11::string::operator+=((string *)local_38,"uniform vec3 ");
      break;
    case Vec4:
      std::__cxx11::string::operator+=((string *)local_38,"uniform vec4 ");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)decl,";");
    std::__cxx11::string::operator+=((string *)local_38,(string *)&__range1_1);
    std::__cxx11::string::~string((string *)&__range1_1);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>
    ::operator++(&__end1);
  }
  this_00 = shader::Source::chunks((Source *)source.field_2._8_8_);
  __end1_1 = std::vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>::begin
                       (this_00);
  chunk = (Chunk *)std::vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>::end
                             (this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_shader::Source::Chunk_*,_std::vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>_>
                        *)&chunk);
    if (!bVar2) {
      Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
LAB_0018b0e5:
      std::__cxx11::string::~string((string *)local_38);
      return __return_storage_ptr__;
    }
    local_d8 = __gnu_cxx::
               __normal_iterator<const_shader::Source::Chunk_*,_std::vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>_>
               ::operator*(&__end1_1);
    TVar1 = local_d8->type;
    if (TVar1 == String) {
LAB_0018afc4:
      std::__cxx11::string::operator+=((string *)local_38,(string *)&local_d8->value);
    }
    else {
      if (TVar1 == Include) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,"Include chunk is invalid in flat shader source",&local_119)
        ;
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Unexpected(&local_f8,&local_118);
        Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,&local_f8);
        Unexpected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~Unexpected(&local_f8);
        std::__cxx11::string::~string((string *)&local_118);
        std::allocator<char>::~allocator(&local_119);
        goto LAB_0018b0e5;
      }
      if (TVar1 == Uniform) goto LAB_0018afc4;
    }
    __gnu_cxx::
    __normal_iterator<const_shader::Source::Chunk_*,_std::vector<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>_>
    ::operator++(&__end1_1);
  } while( true );
}

Assistant:

static Expected<std::string, std::string> shaderPreprocessor(const shader::Source &flat) {
	std::string source;
	if (flat.version() != 0)
		source = format("#version %d\n", flat.version());
	for (const auto &[name, decl]: flat.uniforms()) {
		switch(decl.type) {
			case shader::UniformType::Float:
				source += "uniform float ";
				break;
			case shader::UniformType::Vec2:
				source += "uniform vec2 ";
				break;
			case shader::UniformType::Vec3:
				source += "uniform vec3 ";
				break;
			case shader::UniformType::Vec4:
				source += "uniform vec4 ";
				break;
		}
		source += name + ";";
	}

	for (const auto &chunk: flat.chunks()) {
		switch (chunk.type) {
			case shader::Source::Chunk::Type::Uniform:
			case shader::Source::Chunk::Type::String:
				source += chunk.value;
				break;
			case shader::Source::Chunk::Type::Include:
				return Unexpected<std::string>("Include chunk is invalid in flat shader source");
		}
	}

	return Expected<std::string, std::string>(std::move(source));
}